

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brake.cpp
# Opt level: O0

void __thiscall
ruckig::BrakeProfile::get_velocity_brake_trajectory
          (BrakeProfile *this,double a0,double aMax,double aMin,double jMax)

{
  reference pvVar1;
  double jMax_local;
  double aMin_local;
  double aMax_local;
  double a0_local;
  BrakeProfile *this_local;
  
  pvVar1 = std::array<double,_2UL>::operator[](&this->t,0);
  *pvVar1 = 0.0;
  pvVar1 = std::array<double,_2UL>::operator[](&this->t,1);
  *pvVar1 = 0.0;
  pvVar1 = std::array<double,_2UL>::operator[](&this->j,0);
  *pvVar1 = 0.0;
  pvVar1 = std::array<double,_2UL>::operator[](&this->j,1);
  *pvVar1 = 0.0;
  if ((jMax != 0.0) || (NAN(jMax))) {
    if (a0 <= aMax) {
      if (a0 < aMin) {
        pvVar1 = std::array<double,_2UL>::operator[](&this->j,0);
        *pvVar1 = jMax;
        pvVar1 = std::array<double,_2UL>::operator[](&this->t,0);
        *pvVar1 = -(a0 - aMin) / jMax + 2.2e-14;
      }
    }
    else {
      pvVar1 = std::array<double,_2UL>::operator[](&this->j,0);
      *pvVar1 = -jMax;
      pvVar1 = std::array<double,_2UL>::operator[](&this->t,0);
      *pvVar1 = (a0 - aMax) / jMax + 2.2e-14;
    }
  }
  return;
}

Assistant:

void BrakeProfile::get_velocity_brake_trajectory(double a0, double aMax, double aMin, double jMax) {
    t[0] = 0.0;
    t[1] = 0.0;
    j[0] = 0.0;
    j[1] = 0.0;

    if (jMax == 0.0) {
        return; // Ignore braking for zero-limits
    }

    if (a0 > aMax) {
        j[0] = -jMax;
        t[0] = (a0 - aMax)/jMax + eps;

    } else if (a0 < aMin) {
        j[0] = jMax;
        t[0] = -(a0 - aMin)/jMax + eps;
    }
}